

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.hpp
# Opt level: O2

value __thiscall websocketpp::processor::error::to_ws(error *this,error_code ec)

{
  value vVar1;
  error_category *peVar2;
  uint uVar3;
  
  peVar2 = get_processor_category();
  if (peVar2 == ec._0_8_) {
    uVar3 = (int)this - 3;
    vVar1 = 0x3f3;
    if (uVar3 < 0x17) {
      vVar1 = *(value *)(&DAT_001e0670 + (ulong)uVar3 * 2);
    }
  }
  else {
    vVar1 = 0;
  }
  return vVar1;
}

Assistant:

inline close::status::value to_ws(lib::error_code ec) {
    if (ec.category() != get_processor_category()) {
        return close::status::blank;
    }

    switch (ec.value()) {
        case error::protocol_violation:
        case error::control_too_big:
        case error::invalid_opcode:
        case error::invalid_rsv_bit:
        case error::fragmented_control:
        case error::invalid_continuation:
        case error::masking_required:
        case error::masking_forbidden:
        case error::reserved_close_code:
        case error::invalid_close_code:
            return close::status::protocol_error;
        case error::invalid_payload:
        case error::invalid_utf8:
            return close::status::invalid_payload;
        case error::message_too_big:
            return close::status::message_too_big;
        default:
            return close::status::internal_endpoint_error;
    }
}